

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromZeroExtendedInteger
          (IEEEFloat *this,integerPart *parts,uint width,bool isSigned,roundingMode rounding_mode)

{
  int iVar1;
  opStatus oVar2;
  uint64_t *src;
  APInt local_68;
  APInt local_58;
  ArrayRef<unsigned_long> local_48;
  undefined1 local_38 [8];
  APInt api;
  uint partCount;
  roundingMode rounding_mode_local;
  bool isSigned_local;
  uint width_local;
  integerPart *parts_local;
  IEEEFloat *this_local;
  
  api._12_4_ = rounding_mode;
  api.BitWidth = partCountForBits(width);
  local_48 = makeArrayRef<unsigned_long>(parts,(ulong)api.BitWidth);
  APInt::APInt((APInt *)local_38,width,local_48);
  this->field_0x12 = this->field_0x12 & 0xf7;
  if (isSigned) {
    iVar1 = APInt::tcExtractBit(parts,width - 1);
    if (iVar1 != 0) {
      this->field_0x12 = this->field_0x12 & 0xf7 | 8;
      APInt::APInt(&local_68,(APInt *)local_38);
      llvm::operator-((llvm *)&local_58,&local_68);
      APInt::operator=((APInt *)local_38,&local_58);
      APInt::~APInt(&local_58);
      APInt::~APInt(&local_68);
    }
  }
  src = APInt::getRawData((APInt *)local_38);
  oVar2 = convertFromUnsignedParts(this,src,api.BitWidth,api._12_4_);
  APInt::~APInt((APInt *)local_38);
  return oVar2;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromZeroExtendedInteger(const integerPart *parts,
                                          unsigned int width, bool isSigned,
                                          roundingMode rounding_mode) {
  unsigned int partCount = partCountForBits(width);
  APInt api = APInt(width, makeArrayRef(parts, partCount));

  sign = false;
  if (isSigned && APInt::tcExtractBit(parts, width - 1)) {
    sign = true;
    api = -api;
  }

  return convertFromUnsignedParts(api.getRawData(), partCount, rounding_mode);
}